

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogBegin(ImGuiLogType type,int auto_open_depth)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  GImGui->LogEnabled = true;
  pIVar2->LogType = type;
  pIVar2->LogDepthRef = (pIVar1->DC).TreeDepth;
  if (auto_open_depth < 0) {
    auto_open_depth = pIVar2->LogDepthToExpandDefault;
  }
  pIVar2->LogDepthToExpand = auto_open_depth;
  pIVar2->LogLinePosY = 3.4028235e+38;
  pIVar2->LogLineFirstItem = true;
  return;
}

Assistant:

void ImGui::LogBegin(ImGuiLogType type, int auto_open_depth)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.LogEnabled == false);
    IM_ASSERT(g.LogFile == NULL);
    IM_ASSERT(g.LogBuffer.empty());
    g.LogEnabled = true;
    g.LogType = type;
    g.LogDepthRef = window->DC.TreeDepth;
    g.LogDepthToExpand = ((auto_open_depth >= 0) ? auto_open_depth : g.LogDepthToExpandDefault);
    g.LogLinePosY = FLT_MAX;
    g.LogLineFirstItem = true;
}